

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O2

void __thiscall QLibrary::setLoadHints(QLibrary *this,LoadHints hints)

{
  QLibraryPrivate *otherT;
  QLibraryPrivate *pQVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (this->d).d;
  if (uVar2 < 8) {
    local_38.d = (Data *)0x0;
    local_38.ptr = (char16_t *)0x0;
    local_38.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    pQVar1 = QLibraryStore::findOrCreate((QString *)&local_38,(QString *)&local_58,(LoadHints)0x0);
    (this->d).d = (ulong)((uint)(this->d).d & 7) | (ulong)pQVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QString::clear((QString *)(((this->d).d & 0xfffffffffffffff8) + 0x70));
    uVar2 = (this->d).d;
  }
  QLibraryPrivate::setLoadHints((QLibraryPrivate *)(uVar2 & 0xfffffffffffffff8),hints);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLibrary::setLoadHints(LoadHints hints)
{
    if (!d) {
        d = QLibraryPrivate::findOrCreate(QString());   // ugly, but we need a d-ptr
        d->errorString.clear();
    }
    d->setLoadHints(hints);
}